

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O3

void __thiscall Cpu::Cpu(Cpu *this)

{
  this->rtcc = this->RAM + 1;
  this->status = this->RAM + 3;
  this->fsr = this->RAM + 4;
  this->ra = this->RAM + 5;
  this->rb = this->RAM + 6;
  this->rc = this->RAM + 7;
  this->rd = this->RAM + 8;
  this->re = this->RAM + 9;
  this->w = this->RAM + 0x105;
  memset(this,0,0x106);
  memset(this->SRAM,0,0x20000);
  this->cycle = 0;
  this->cycle2 = 0;
  this->prescaler = 0;
  this->sp = this->Stack;
  this->pc = 0xfff;
  this->mode = '\0';
  return;
}

Assistant:

Cpu::Cpu ()
{
	rtcc = &RAM[1];
	status = &RAM[3];
	fsr = &RAM[4];
	ra = &RAM[5];
	rb = &RAM[6];
	rc = &RAM[7];
	rd = &RAM[8];
	re = &RAM[9];
	w = &RAM[261];
	reset();
}